

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references_inc.h
# Opt level: O3

void CreateBackwardReferencesH42
               (size_t num_bytes,size_t position,uint8_t *ringbuffer,size_t ringbuffer_mask,
               BrotliEncoderParams *params,H42 *hasher,int *dist_cache,size_t *last_insert_len,
               Command *commands,size_t *num_commands,size_t *num_literals)

{
  ulong uVar1;
  int *piVar2;
  long lVar3;
  ulong uVar4;
  ushort uVar5;
  size_t sVar6;
  int iVar7;
  bool bVar8;
  bool bVar9;
  uint uVar10;
  ulong uVar11;
  long lVar12;
  ulong uVar13;
  ulong uVar14;
  long lVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  ushort uVar19;
  int *piVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  uint16_t uVar25;
  ulong uVar26;
  byte bVar27;
  int iVar28;
  long lVar29;
  ulong uVar30;
  size_t sVar31;
  ulong uVar32;
  char *pcVar33;
  ulong uVar34;
  uint32_t uVar35;
  size_t sVar36;
  ulong uVar37;
  ulong uVar38;
  uint uVar39;
  ulong uVar40;
  uint uVar41;
  size_t i;
  bool bVar42;
  ulong local_140;
  ulong local_128;
  ulong local_118;
  Command *local_110;
  ulong local_108;
  ulong local_100;
  ulong local_f8;
  ulong local_f0;
  ulong local_e8;
  ulong local_d8;
  ulong local_b8;
  
  uVar4 = (position - 3) + num_bytes;
  sVar36 = position;
  if (3 < num_bytes) {
    sVar36 = uVar4;
  }
  lVar29 = 0x200;
  if (params->quality < 9) {
    lVar29 = 0x40;
  }
  uVar38 = *last_insert_len;
  uVar1 = position + num_bytes;
  local_110 = commands;
  if (uVar1 <= position + 4) {
LAB_0010d396:
    *last_insert_len = (uVar38 + uVar1) - position;
    *num_commands = *num_commands + ((long)local_110 - (long)commands >> 4);
    return;
  }
  uVar40 = (1L << ((byte)params->lgwin & 0x3f)) - 0x10;
  local_d8 = lVar29 + position;
  lVar3 = position - 1;
  uVar34 = position;
LAB_0010c0a8:
  local_100 = uVar1 - uVar34;
  uVar37 = uVar40;
  if (uVar34 < uVar40) {
    uVar37 = uVar34;
  }
  uVar14 = uVar34 & ringbuffer_mask;
  piVar2 = (int *)(ringbuffer + uVar14);
  uVar39 = (uint)(*(int *)(ringbuffer + uVar14) * 0x1e35a7bd) >> 0x11;
  uVar13 = (ulong)((uint)local_100 & 7);
  uVar11 = local_100 & 0xfffffffffffffff8;
  local_f0 = 0x1f90;
  bVar42 = false;
  uVar18 = 0;
  lVar12 = 0;
  local_108 = 0;
  local_f8 = 0;
  do {
    uVar17 = (long)kDistanceCacheOffset[lVar12] + (long)dist_cache[kDistanceCacheIndex[lVar12]];
    uVar30 = uVar34 - uVar17;
    if ((((lVar12 == 0) || (hasher->tiny_hash[uVar30 & 0xffff] == (uint8_t)uVar39)) &&
        (uVar17 <= uVar37)) && (uVar30 < uVar34)) {
      if (7 < local_100) {
        lVar15 = 0;
        uVar26 = 0;
LAB_0010c199:
        if (*(ulong *)(piVar2 + uVar26 * 2) ==
            *(ulong *)(ringbuffer + uVar26 * 8 + (uVar30 & ringbuffer_mask))) goto code_r0x0010c1a6;
        uVar26 = *(ulong *)(ringbuffer + uVar26 * 8 + (uVar30 & ringbuffer_mask)) ^
                 *(ulong *)(piVar2 + uVar26 * 2);
        uVar30 = 0;
        if (uVar26 != 0) {
          for (; (uVar26 >> uVar30 & 1) == 0; uVar30 = uVar30 + 1) {
          }
        }
        uVar26 = (uVar30 >> 3 & 0x1fffffff) - lVar15;
        goto LAB_0010c1d8;
      }
      piVar20 = piVar2;
      uVar32 = 0;
LAB_0010c222:
      uVar26 = uVar32;
      if (uVar13 != 0) {
        uVar22 = uVar13 | uVar32;
        uVar16 = uVar13;
        do {
          uVar26 = uVar32;
          if (ringbuffer[uVar32 + (uVar30 & ringbuffer_mask)] != (uint8_t)*piVar20) break;
          piVar20 = (int *)((long)piVar20 + 1);
          uVar32 = uVar32 + 1;
          uVar16 = uVar16 - 1;
          uVar26 = uVar22;
        } while (uVar16 != 0);
      }
LAB_0010c1d8:
      if ((1 < uVar26) &&
         (uVar30 = uVar26 * 0x21c + kDistanceShortCodeCost[lVar12], local_f0 < uVar30)) {
        bVar42 = true;
        uVar18 = uVar26;
        local_f0 = uVar30;
        local_108 = uVar26;
        local_f8 = uVar17;
      }
    }
    lVar12 = lVar12 + 1;
  } while (lVar12 != 0x10);
  uVar41 = uVar39 & 0x1ff;
  sVar6 = hasher->max_hops;
  uVar17 = uVar34 - hasher->addr[uVar39];
  uVar5 = hasher->head[uVar39];
  if (sVar6 != 0) {
    uVar26 = 0;
    sVar31 = sVar6;
    uVar30 = uVar17;
    uVar19 = uVar5;
    do {
      uVar26 = uVar30 + uVar26;
      if (uVar37 < uVar26) break;
      if (uVar14 + uVar18 <= ringbuffer_mask) {
        uVar30 = uVar34 - uVar26 & ringbuffer_mask;
        if ((uVar30 + uVar18 <= ringbuffer_mask) &&
           (ringbuffer[uVar14 + uVar18] == ringbuffer[uVar30 + uVar18])) {
          if (7 < local_100) {
            lVar12 = 0;
            uVar32 = 0;
LAB_0010c320:
            if (*(ulong *)(piVar2 + uVar32 * 2) == *(ulong *)(ringbuffer + uVar32 * 8 + uVar30))
            goto code_r0x0010c332;
            uVar32 = *(ulong *)(ringbuffer + uVar32 * 8 + uVar30) ^ *(ulong *)(piVar2 + uVar32 * 2);
            uVar30 = 0;
            if (uVar32 != 0) {
              for (; (uVar32 >> uVar30 & 1) == 0; uVar30 = uVar30 + 1) {
              }
            }
            uVar32 = (uVar30 >> 3 & 0x1fffffff) - lVar12;
            goto LAB_0010c395;
          }
          piVar20 = piVar2;
          uVar16 = 0;
LAB_0010c3f0:
          uVar32 = uVar16;
          if (uVar13 != 0) {
            uVar23 = uVar13 | uVar16;
            uVar22 = uVar13;
            do {
              uVar32 = uVar16;
              if (ringbuffer[uVar16 + uVar30] != (uint8_t)*piVar20) break;
              piVar20 = (int *)((long)piVar20 + 1);
              uVar16 = uVar16 + 1;
              uVar22 = uVar22 - 1;
              uVar32 = uVar23;
            } while (uVar22 != 0);
          }
LAB_0010c395:
          if (3 < uVar32) {
            iVar28 = 0x1f;
            if ((uint)uVar26 != 0) {
              for (; (uint)uVar26 >> iVar28 == 0; iVar28 = iVar28 + -1) {
              }
            }
            uVar30 = (ulong)(iVar28 * -0x78 + 0x1e00) + uVar32 * 0x21c;
            if (local_f0 < uVar30) {
              bVar42 = true;
              uVar18 = uVar32;
              local_f0 = uVar30;
              local_108 = uVar32;
              local_f8 = uVar26;
            }
          }
        }
      }
      uVar30 = (ulong)*(ushort *)
                       ((long)&hasher->banks[0].slots[uVar19].delta + (ulong)(uVar41 << 0xb));
      sVar31 = sVar31 - 1;
      uVar19 = *(ushort *)((long)&hasher->banks[0].slots[uVar19].next + (ulong)(uVar41 << 0xb));
    } while (sVar31 != 0);
  }
  uVar19 = hasher->free_slot_idx[uVar41];
  hasher->free_slot_idx[uVar41] = uVar19 + 1;
  uVar10 = uVar19 & 0x1ff;
  hasher->tiny_hash[uVar34 & 0xffff] = (uint8_t)uVar39;
  if (0xfffe < uVar17) {
    uVar17 = 0xffff;
  }
  *(short *)((long)&hasher->banks[0].slots[uVar10].delta + (ulong)(uVar41 << 0xb)) = (short)uVar17;
  *(ushort *)((long)&hasher->banks[0].slots[uVar10].next + (ulong)(uVar41 << 0xb)) = uVar5;
  hasher->addr[uVar39] = (uint32_t)uVar34;
  hasher->head[uVar39] = (uint16_t)uVar10;
  if (bVar42) {
    local_b8 = 0;
LAB_0010c49f:
    uVar37 = uVar38 + 4;
    uVar18 = (lVar3 + num_bytes) - uVar34;
    iVar28 = 0;
LAB_0010c4cf:
    local_100 = local_100 - 1;
    uVar11 = local_108 - 1;
    if (local_100 <= local_108 - 1) {
      uVar11 = local_100;
    }
    if (4 < params->quality) {
      uVar11 = 0;
    }
    uVar14 = uVar34 + 1;
    uVar13 = uVar40;
    if (uVar14 < uVar40) {
      uVar13 = uVar14;
    }
    uVar26 = uVar14 & ringbuffer_mask;
    piVar2 = (int *)(ringbuffer + uVar26);
    uVar39 = (uint)(*(int *)(ringbuffer + uVar26) * 0x1e35a7bd) >> 0x11;
    uVar32 = (ulong)((uint)local_100 & 7);
    uVar17 = 0x1f90;
    bVar42 = false;
    lVar12 = 0;
    local_128 = 0;
    uVar30 = 0;
LAB_0010c577:
    uVar16 = (long)kDistanceCacheOffset[lVar12] + (long)dist_cache[kDistanceCacheIndex[lVar12]];
    uVar22 = uVar14 - uVar16;
    if ((((lVar12 == 0) || (hasher->tiny_hash[uVar22 & 0xffff] == (uint8_t)uVar39)) &&
        (uVar16 <= uVar13)) && (uVar22 < uVar14)) {
      uVar23 = uVar32;
      if (7 < local_100) {
        lVar15 = 0;
        uVar24 = 0;
LAB_0010c5d9:
        if (*(ulong *)(piVar2 + uVar24 * 2) ==
            *(ulong *)(ringbuffer + uVar24 * 8 + (uVar22 & ringbuffer_mask))) goto code_r0x0010c5eb;
        uVar23 = *(ulong *)(ringbuffer + uVar24 * 8 + (uVar22 & ringbuffer_mask)) ^
                 *(ulong *)(piVar2 + uVar24 * 2);
        uVar22 = 0;
        if (uVar23 != 0) {
          for (; (uVar23 >> uVar22 & 1) == 0; uVar22 = uVar22 + 1) {
          }
        }
        uVar24 = (uVar22 >> 3 & 0x1fffffff) - lVar15;
        goto LAB_0010c620;
      }
      uVar24 = 0;
      piVar20 = piVar2;
      goto joined_r0x0010c683;
    }
    goto LAB_0010c665;
  }
  uVar18 = (hasher->dict_search_stats_).num_lookups;
  uVar11 = (hasher->dict_search_stats_).num_matches;
  if (uVar18 >> 7 <= uVar11) {
    uVar30 = (ulong)((uint)(*piVar2 * 0x1e35a7bd) >> 0x11 & 0xfffffffe);
    bVar9 = true;
    local_b8 = 0;
    bVar42 = bVar9;
    uVar14 = local_f0;
    uVar13 = local_f8;
    uVar17 = local_108;
LAB_0010cbcb:
    uVar5 = kStaticDictionaryHash[uVar30];
    uVar18 = uVar18 + 1;
    (hasher->dict_search_stats_).num_lookups = uVar18;
    if ((ulong)uVar5 != 0) {
      uVar26 = (ulong)(uVar5 & 0x1f);
      if (local_100 < uVar26) goto LAB_0010ccee;
      pcVar33 = &kBrotliDictionary +
                uVar26 * (uVar5 >> 5) +
                (ulong)*(uint *)(&kBrotliDictionaryOffsetsByLength + uVar26 * 4);
      if (7 < uVar26) {
        uVar32 = (ulong)(uVar5 & 0x18);
        lVar12 = 0;
        uVar16 = 0;
LAB_0010cc3f:
        if (*(ulong *)(pcVar33 + uVar16 * 8) == *(ulong *)(piVar2 + uVar16 * 2))
        goto code_r0x0010cc51;
        uVar16 = *(ulong *)(piVar2 + uVar16 * 2) ^ *(ulong *)(pcVar33 + uVar16 * 8);
        uVar32 = 0;
        if (uVar16 != 0) {
          for (; (uVar16 >> uVar32 & 1) == 0; uVar32 = uVar32 + 1) {
          }
        }
        local_108 = (uVar32 >> 3 & 0x1fffffff) - lVar12;
        goto LAB_0010cc96;
      }
      uVar32 = 0;
      goto LAB_0010cd08;
    }
    goto LAB_0010ccee;
  }
LAB_0010cf2b:
  uVar38 = uVar38 + 1;
  position = uVar34 + 1;
  if (local_d8 < position) {
    if ((uint)((int)lVar29 * 4) + local_d8 < position) {
      uVar37 = uVar34 + 0x11;
      if (uVar1 - 4 <= uVar34 + 0x11) {
        uVar37 = uVar1 - 4;
      }
      for (; position < uVar37; position = position + 4) {
        uVar39 = (uint)(*(int *)(ringbuffer + (position & ringbuffer_mask)) * 0x1e35a7bd) >> 0x11;
        uVar10 = uVar39 & 0x1ff;
        uVar5 = hasher->free_slot_idx[uVar10];
        hasher->free_slot_idx[uVar10] = uVar5 + 1;
        uVar41 = uVar5 & 0x1ff;
        uVar34 = position - hasher->addr[uVar39];
        if (0xfffe < uVar34) {
          uVar34 = 0xffff;
        }
        hasher->tiny_hash[position & 0xffff] = (uint8_t)uVar39;
        *(short *)((long)&hasher->banks[0].slots[uVar41].delta + (ulong)(uVar10 << 0xb)) =
             (short)uVar34;
        *(uint16_t *)((long)&hasher->banks[0].slots[uVar41].next + (ulong)(uVar10 << 0xb)) =
             hasher->head[uVar39];
        hasher->addr[uVar39] = (uint32_t)position;
        hasher->head[uVar39] = (uint16_t)uVar41;
        uVar38 = uVar38 + 4;
      }
    }
    else {
      uVar37 = uVar34 + 9;
      if (uVar4 <= uVar34 + 9) {
        uVar37 = uVar4;
      }
      for (; position < uVar37; position = position + 2) {
        uVar39 = (uint)(*(int *)(ringbuffer + (position & ringbuffer_mask)) * 0x1e35a7bd) >> 0x11;
        uVar10 = uVar39 & 0x1ff;
        uVar5 = hasher->free_slot_idx[uVar10];
        hasher->free_slot_idx[uVar10] = uVar5 + 1;
        uVar41 = uVar5 & 0x1ff;
        uVar34 = position - hasher->addr[uVar39];
        if (0xfffe < uVar34) {
          uVar34 = 0xffff;
        }
        hasher->tiny_hash[position & 0xffff] = (uint8_t)uVar39;
        *(short *)((long)&hasher->banks[0].slots[uVar41].delta + (ulong)(uVar10 << 0xb)) =
             (short)uVar34;
        *(uint16_t *)((long)&hasher->banks[0].slots[uVar41].next + (ulong)(uVar10 << 0xb)) =
             hasher->head[uVar39];
        hasher->addr[uVar39] = (uint32_t)position;
        hasher->head[uVar39] = (uint16_t)uVar41;
        uVar38 = uVar38 + 2;
      }
    }
  }
  goto LAB_0010d25d;
code_r0x0010c1a6:
  uVar26 = uVar26 + 1;
  lVar15 = lVar15 + -8;
  piVar20 = (int *)(uVar11 + (long)piVar2);
  uVar32 = uVar11;
  if (local_100 >> 3 == uVar26) goto LAB_0010c222;
  goto LAB_0010c199;
code_r0x0010c332:
  uVar32 = uVar32 + 1;
  lVar12 = lVar12 + -8;
  piVar20 = (int *)(uVar11 + (long)piVar2);
  uVar16 = uVar11;
  if (local_100 >> 3 == uVar32) goto LAB_0010c3f0;
  goto LAB_0010c320;
code_r0x0010cc51:
  uVar16 = uVar16 + 1;
  lVar12 = lVar12 + -8;
  if ((uVar5 & 0x1f) >> 3 == uVar16) goto code_r0x0010cc5d;
  goto LAB_0010cc3f;
code_r0x0010cc5d:
  pcVar33 = pcVar33 + -lVar12;
LAB_0010cd08:
  uVar16 = (ulong)uVar5 & 7;
  local_108 = uVar32;
  if ((uVar5 & 7) != 0) {
    uVar22 = uVar32 | uVar16;
    do {
      local_108 = uVar32;
      if (*(char *)((long)piVar2 + uVar32) != *pcVar33) break;
      pcVar33 = pcVar33 + 1;
      uVar32 = uVar32 + 1;
      uVar16 = uVar16 - 1;
      local_108 = uVar22;
    } while (uVar16 != 0);
  }
LAB_0010cc96:
  if ((local_108 != 0) && (uVar26 < local_108 + 10)) {
    local_f8 = (ulong)(uVar5 >> 5) + uVar37 + 1 +
               ((ulong)""[uVar26 - local_108] <<
               ((&kBrotliDictionarySizeBitsByLength)[uVar26] & 0x3f));
    iVar28 = 0x1f;
    if ((uint)local_f8 != 0) {
      for (; (uint)local_f8 >> iVar28 == 0; iVar28 = iVar28 + -1) {
      }
    }
    local_f0 = (local_108 * 0x21c - (ulong)(uint)(iVar28 * 0x78)) + 0x1e00;
    if (uVar14 <= local_f0) {
      local_b8 = uVar26 ^ local_108;
      uVar11 = uVar11 + 1;
      (hasher->dict_search_stats_).num_matches = uVar11;
      uVar30 = uVar30 + 1;
      bVar9 = false;
      bVar8 = !bVar42;
      bVar42 = bVar9;
      uVar14 = local_f0;
      uVar13 = local_f8;
      uVar17 = local_108;
      if (bVar8) goto LAB_0010c49f;
      goto LAB_0010cbcb;
    }
  }
LAB_0010ccee:
  uVar30 = uVar30 + 1;
  bVar8 = !bVar42;
  bVar42 = false;
  if (bVar8) {
    local_f0 = uVar14;
    local_108 = uVar17;
    local_f8 = uVar13;
    if (bVar9) goto LAB_0010cf2b;
    goto LAB_0010c49f;
  }
  goto LAB_0010cbcb;
code_r0x0010c5eb:
  uVar24 = uVar24 + 1;
  lVar15 = lVar15 + -8;
  if (uVar18 >> 3 == uVar24) goto code_r0x0010c5f9;
  goto LAB_0010c5d9;
code_r0x0010c5f9:
  uVar24 = -lVar15;
  piVar20 = (int *)((long)piVar2 - lVar15);
joined_r0x0010c683:
  for (; (uVar23 != 0 && (ringbuffer[uVar24 + (uVar22 & ringbuffer_mask)] == (uint8_t)*piVar20));
      uVar24 = uVar24 + 1) {
    uVar23 = uVar23 - 1;
    piVar20 = (int *)((long)piVar20 + 1);
  }
LAB_0010c620:
  if ((1 < uVar24) && (uVar22 = uVar24 * 0x21c + kDistanceShortCodeCost[lVar12], uVar17 < uVar22)) {
    bVar42 = true;
    uVar17 = uVar22;
    uVar11 = uVar24;
    uVar30 = uVar16;
    local_128 = uVar24;
  }
LAB_0010c665:
  lVar12 = lVar12 + 1;
  if (lVar12 == 0x10) goto LAB_0010c6aa;
  goto LAB_0010c577;
LAB_0010c6aa:
  uVar41 = uVar39 & 0x1ff;
  uVar16 = uVar14 - hasher->addr[uVar39];
  uVar5 = hasher->head[uVar39];
  if (sVar6 != 0) {
    uVar23 = 0;
    uVar22 = uVar16;
    sVar31 = sVar6;
    uVar19 = uVar5;
LAB_0010c6fb:
    uVar23 = uVar22 + uVar23;
    if (uVar23 <= uVar13) {
      if (uVar26 + uVar11 <= ringbuffer_mask) {
        uVar22 = uVar14 - uVar23 & ringbuffer_mask;
        if ((ringbuffer_mask < uVar22 + uVar11) ||
           (ringbuffer[uVar26 + uVar11] != ringbuffer[uVar22 + uVar11])) goto LAB_0010c7e2;
        uVar24 = uVar32;
        if (7 < local_100) {
          lVar12 = 0;
          uVar21 = 0;
LAB_0010c758:
          if (*(ulong *)(piVar2 + uVar21 * 2) == *(ulong *)(ringbuffer + uVar21 * 8 + uVar22))
          goto code_r0x0010c76a;
          uVar24 = *(ulong *)(ringbuffer + uVar21 * 8 + uVar22) ^ *(ulong *)(piVar2 + uVar21 * 2);
          uVar22 = 0;
          if (uVar24 != 0) {
            for (; (uVar24 >> uVar22 & 1) == 0; uVar22 = uVar22 + 1) {
            }
          }
          uVar21 = (uVar22 >> 3 & 0x1fffffff) - lVar12;
          goto LAB_0010c79f;
        }
        uVar21 = 0;
        piVar20 = piVar2;
        goto joined_r0x0010c80a;
      }
      goto LAB_0010c7e2;
    }
  }
LAB_0010c848:
  uVar19 = hasher->free_slot_idx[uVar41];
  hasher->free_slot_idx[uVar41] = uVar19 + 1;
  uVar10 = uVar19 & 0x1ff;
  hasher->tiny_hash[uVar14 & 0xffff] = (uint8_t)uVar39;
  if (0xfffe < uVar16) {
    uVar16 = 0xffff;
  }
  *(short *)((long)&hasher->banks[0].slots[uVar10].delta + (ulong)(uVar41 << 0xb)) = (short)uVar16;
  *(ushort *)((long)&hasher->banks[0].slots[uVar10].next + (ulong)(uVar41 << 0xb)) = uVar5;
  hasher->addr[uVar39] = (uint32_t)uVar14;
  hasher->head[uVar39] = (uint16_t)uVar10;
  uVar11 = uVar38;
  uVar26 = uVar34;
  if (bVar42) {
    uVar32 = local_128;
    local_128 = 0;
LAB_0010cafc:
    if ((uVar17 < local_f0 + 700) ||
       (local_108 = uVar32, uVar11 = uVar37, local_b8 = local_128, uVar26 = uVar14,
       local_f8 = uVar30, iVar28 == 3)) goto LAB_0010cdaf;
    uVar38 = uVar38 + 1;
    iVar28 = iVar28 + 1;
    uVar13 = uVar34 + 5;
    uVar18 = uVar18 - 1;
    uVar34 = uVar14;
    uVar11 = uVar38;
    local_f0 = uVar17;
    if (uVar1 <= uVar13) goto LAB_0010cdaf;
    goto LAB_0010c4cf;
  }
  uVar16 = (hasher->dict_search_stats_).num_lookups;
  local_d8 = (hasher->dict_search_stats_).num_matches;
  if (uVar16 >> 7 <= local_d8) {
    uVar22 = (ulong)((uint)(*piVar2 * 0x1e35a7bd) >> 0x11 & 0xfffffffe);
    bVar42 = true;
    local_140 = local_128;
    local_128 = 0;
    local_e8 = uVar30;
    local_118 = uVar17;
    bVar9 = bVar42;
LAB_0010c937:
    uVar5 = kStaticDictionaryHash[uVar22];
    uVar16 = uVar16 + 1;
    (hasher->dict_search_stats_).num_lookups = uVar16;
    if ((ulong)uVar5 != 0) {
      uVar23 = (ulong)(uVar5 & 0x1f);
      if (local_100 < uVar23) goto LAB_0010ca4c;
      pcVar33 = &kBrotliDictionary +
                uVar23 * (uVar5 >> 5) +
                (ulong)*(uint *)(&kBrotliDictionaryOffsetsByLength + uVar23 * 4);
      if (7 < uVar23) {
        uVar17 = (ulong)(uVar5 & 0x18);
        lVar12 = 0;
        uVar30 = 0;
LAB_0010c99f:
        if (*(ulong *)(pcVar33 + uVar30 * 8) == *(ulong *)(piVar2 + uVar30 * 2))
        goto code_r0x0010c9b1;
        uVar30 = *(ulong *)(piVar2 + uVar30 * 2) ^ *(ulong *)(pcVar33 + uVar30 * 8);
        uVar17 = 0;
        if (uVar30 != 0) {
          for (; (uVar30 >> uVar17 & 1) == 0; uVar17 = uVar17 + 1) {
          }
        }
        uVar32 = (uVar17 >> 3 & 0x1fffffff) - lVar12;
        goto LAB_0010c9fa;
      }
      uVar17 = 0;
      goto LAB_0010ca63;
    }
    goto LAB_0010ca4c;
  }
LAB_0010cdaf:
  uVar38 = uVar40;
  if (uVar26 < uVar40) {
    uVar38 = uVar26;
  }
  uVar35 = (uint32_t)uVar11;
  if (uVar38 < local_f8) {
LAB_0010cdc4:
    uVar34 = local_f8 + 0xf;
LAB_0010cdc8:
    if ((local_f8 <= uVar38) && (uVar34 != 0)) {
      dist_cache[3] = dist_cache[2];
      *(undefined8 *)(dist_cache + 1) = *(undefined8 *)dist_cache;
      *dist_cache = (int)local_f8;
    }
    local_110->insert_len_ = uVar35;
    local_110->copy_len_ = (uint)local_108 | (int)local_b8 << 0x18;
    if (0xf < uVar34) {
      uVar39 = 0x1f;
      uVar41 = (uint)(uVar34 - 0xc);
      if (uVar41 != 0) {
        for (; uVar41 >> uVar39 == 0; uVar39 = uVar39 - 1) {
        }
      }
      uVar10 = (uVar39 ^ 0xffffffe0) + 0x1f;
      bVar42 = (uVar34 - 0xc >> ((ulong)uVar10 & 0x3f) & 1) != 0;
      uVar25 = (ushort)bVar42 + (short)(uVar39 ^ 0xffffffe0) * 2 + 0x4c;
      local_110->dist_prefix_ = uVar25;
      uVar39 = uVar41 - (bVar42 + 2 << ((byte)uVar10 & 0x3f)) | uVar10 * 0x1000000;
      goto LAB_0010ceb7;
    }
  }
  else {
    if (local_f8 != (long)*dist_cache) {
      uVar34 = 1;
      if (local_f8 != (long)dist_cache[1]) {
        uVar34 = (local_f8 + 3) - (long)*dist_cache;
        if (uVar34 < 7) {
          bVar27 = (byte)((int)uVar34 << 2);
          uVar39 = 0x9750468;
        }
        else {
          uVar34 = (local_f8 + 3) - (long)dist_cache[1];
          if (6 < uVar34) {
            uVar34 = 2;
            if ((local_f8 != (long)dist_cache[2]) && (uVar34 = 3, local_f8 != (long)dist_cache[3]))
            goto LAB_0010cdc4;
            goto LAB_0010cdc8;
          }
          bVar27 = (byte)((int)uVar34 << 2);
          uVar39 = 0xfdb1ace;
        }
        uVar34 = (ulong)(uVar39 >> (bVar27 & 0x1f) & 0xf);
      }
      goto LAB_0010cdc8;
    }
    local_110->insert_len_ = uVar35;
    local_110->copy_len_ = (uint)local_108 | (int)local_b8 << 0x18;
    uVar34 = 0;
  }
  uVar25 = (uint16_t)uVar34;
  local_110->dist_prefix_ = uVar25;
  uVar39 = 0;
LAB_0010ceb7:
  local_b8 = local_b8 ^ local_108;
  local_110->dist_extra_ = uVar39;
  uVar38 = uVar11;
  if (5 < uVar11) {
    if (uVar11 < 0x82) {
      uVar39 = 0x1f;
      uVar41 = (uint)(uVar11 - 2);
      if (uVar41 != 0) {
        for (; uVar41 >> uVar39 == 0; uVar39 = uVar39 - 1) {
        }
      }
      uVar38 = (ulong)((int)(uVar11 - 2 >> ((char)(uVar39 ^ 0xffffffe0) + 0x1fU & 0x3f)) +
                       (uVar39 ^ 0xffffffe0) * 2 + 0x40);
    }
    else if (uVar11 < 0x842) {
      uVar39 = 0x1f;
      if (uVar35 - 0x42 != 0) {
        for (; uVar35 - 0x42 >> uVar39 == 0; uVar39 = uVar39 - 1) {
        }
      }
      uVar38 = (ulong)((uVar39 ^ 0xffe0) + 0x2a);
    }
    else {
      uVar38 = 0x15;
      if (0x1841 < uVar11) {
        uVar38 = (ulong)(ushort)(0x17 - (uVar11 < 0x5842));
      }
    }
  }
  if (local_b8 < 10) {
    uVar39 = (int)local_b8 - 2;
  }
  else if (local_b8 < 0x86) {
    uVar39 = 0x1f;
    uVar41 = (uint)(local_b8 - 6);
    if (uVar41 != 0) {
      for (; uVar41 >> uVar39 == 0; uVar39 = uVar39 - 1) {
      }
    }
    uVar39 = (int)(local_b8 - 6 >> ((char)(uVar39 ^ 0xffffffe0) + 0x1fU & 0x3f)) +
             (uVar39 ^ 0xffffffe0) * 2 + 0x42;
  }
  else {
    uVar39 = 0x17;
    if (local_b8 < 0x846) {
      uVar41 = (int)local_b8 - 0x46;
      uVar39 = 0x1f;
      if (uVar41 != 0) {
        for (; uVar41 >> uVar39 == 0; uVar39 = uVar39 - 1) {
        }
      }
      uVar39 = (uVar39 ^ 0xffe0) + 0x2c;
    }
  }
  uVar5 = (ushort)uVar39;
  uVar19 = (uVar5 & 7) + ((ushort)uVar38 & 7) * 8;
  if (((uVar25 == 0) && ((ushort)uVar38 < 8)) && (uVar5 < 0x10)) {
    if (7 < uVar5) {
      uVar19 = uVar19 | 0x40;
    }
  }
  else {
    uVar19 = uVar19 | *(ushort *)
                       (CombineLengthCodes_cells +
                       (ulong)((int)((uVar38 & 0xffff) >> 3) * 3 + ((uVar39 & 0xffff) >> 3)) * 2);
  }
  local_110->cmd_prefix_ = uVar19;
  *num_literals = *num_literals + uVar11;
  local_d8 = lVar29 + uVar26 + local_108 * 2;
  position = local_108 + uVar26;
  uVar26 = uVar26 + 2;
  uVar38 = sVar36;
  if (position < sVar36) {
    uVar38 = position;
  }
  if (uVar26 < uVar38) {
    do {
      uVar39 = (uint)(*(int *)(ringbuffer + (uVar26 & ringbuffer_mask)) * 0x1e35a7bd) >> 0x11;
      uVar10 = uVar39 & 0x1ff;
      uVar5 = hasher->free_slot_idx[uVar10];
      hasher->free_slot_idx[uVar10] = uVar5 + 1;
      uVar41 = uVar5 & 0x1ff;
      uVar34 = uVar26 - hasher->addr[uVar39];
      hasher->tiny_hash[uVar26 & 0xffff] = (uint8_t)uVar39;
      if (0xfffe < uVar34) {
        uVar34 = 0xffff;
      }
      *(short *)((long)&hasher->banks[0].slots[uVar41].delta + (ulong)(uVar10 << 0xb)) =
           (short)uVar34;
      *(uint16_t *)((long)&hasher->banks[0].slots[uVar41].next + (ulong)(uVar10 << 0xb)) =
           hasher->head[uVar39];
      hasher->addr[uVar39] = (uint32_t)uVar26;
      hasher->head[uVar39] = (uint16_t)uVar41;
      uVar26 = uVar26 + 1;
    } while (uVar38 != uVar26);
    uVar38 = 0;
    local_110 = local_110 + 1;
  }
  else {
    uVar38 = 0;
    local_110 = local_110 + 1;
  }
LAB_0010d25d:
  uVar34 = position;
  if (uVar1 <= position + 4) goto LAB_0010d396;
  goto LAB_0010c0a8;
code_r0x0010c76a:
  uVar21 = uVar21 + 1;
  lVar12 = lVar12 + -8;
  if (uVar18 >> 3 == uVar21) goto code_r0x0010c778;
  goto LAB_0010c758;
code_r0x0010c778:
  uVar21 = -lVar12;
  piVar20 = (int *)((long)piVar2 - lVar12);
joined_r0x0010c80a:
  for (; (uVar24 != 0 && (ringbuffer[uVar21 + uVar22] == (uint8_t)*piVar20)); uVar21 = uVar21 + 1) {
    uVar24 = uVar24 - 1;
    piVar20 = (int *)((long)piVar20 + 1);
  }
LAB_0010c79f:
  if (3 < uVar21) {
    iVar7 = 0x1f;
    if ((uint)uVar23 != 0) {
      for (; (uint)uVar23 >> iVar7 == 0; iVar7 = iVar7 + -1) {
      }
    }
    uVar22 = (ulong)(iVar7 * -0x78 + 0x1e00) + uVar21 * 0x21c;
    if (uVar17 < uVar22) {
      bVar42 = true;
      uVar17 = uVar22;
      uVar11 = uVar21;
      uVar30 = uVar23;
      local_128 = uVar21;
    }
  }
LAB_0010c7e2:
  uVar22 = (ulong)*(ushort *)((long)&hasher->banks[0].slots[uVar19].delta + (ulong)(uVar41 << 0xb));
  sVar31 = sVar31 - 1;
  uVar19 = *(ushort *)((long)&hasher->banks[0].slots[uVar19].next + (ulong)(uVar41 << 0xb));
  if (sVar31 == 0) goto LAB_0010c848;
  goto LAB_0010c6fb;
code_r0x0010c9b1:
  uVar30 = uVar30 + 1;
  lVar12 = lVar12 + -8;
  if ((uVar5 & 0x1f) >> 3 == uVar30) goto code_r0x0010c9bd;
  goto LAB_0010c99f;
code_r0x0010c9bd:
  pcVar33 = pcVar33 + -lVar12;
LAB_0010ca63:
  uVar30 = (ulong)uVar5 & 7;
  uVar32 = uVar17;
  if ((uVar5 & 7) != 0) {
    uVar24 = uVar17 | uVar30;
    do {
      uVar32 = uVar17;
      if (*(char *)((long)piVar2 + uVar17) != *pcVar33) break;
      pcVar33 = pcVar33 + 1;
      uVar17 = uVar17 + 1;
      uVar30 = uVar30 - 1;
      uVar32 = uVar24;
    } while (uVar30 != 0);
  }
LAB_0010c9fa:
  if ((uVar32 != 0) && (uVar23 < uVar32 + 10)) {
    uVar30 = (ulong)(uVar5 >> 5) + uVar13 + 1 +
             ((ulong)""[uVar23 - uVar32] << ((&kBrotliDictionarySizeBitsByLength)[uVar23] & 0x3f));
    iVar7 = 0x1f;
    if ((uint)uVar30 != 0) {
      for (; (uint)uVar30 >> iVar7 == 0; iVar7 = iVar7 + -1) {
      }
    }
    uVar17 = (uVar32 * 0x21c - (ulong)(uint)(iVar7 * 0x78)) + 0x1e00;
    if (local_118 <= uVar17) {
      local_128 = uVar23 ^ uVar32;
      local_d8 = local_d8 + 1;
      (hasher->dict_search_stats_).num_matches = local_d8;
      uVar22 = uVar22 + 1;
      bVar8 = !bVar42;
      bVar42 = false;
      local_e8 = uVar30;
      local_118 = uVar17;
      local_140 = uVar32;
      bVar9 = bVar42;
      if (bVar8) goto LAB_0010cafc;
      goto LAB_0010c937;
    }
  }
LAB_0010ca4c:
  uVar22 = uVar22 + 1;
  bVar8 = !bVar42;
  bVar42 = false;
  if (bVar8) {
    uVar17 = local_118;
    uVar32 = local_140;
    uVar30 = local_e8;
    if (bVar9) goto LAB_0010cdaf;
    goto LAB_0010cafc;
  }
  goto LAB_0010c937;
}

Assistant:

static BROTLI_NOINLINE void FN(CreateBackwardReferences)(
    size_t num_bytes, size_t position,
    const uint8_t* ringbuffer, size_t ringbuffer_mask,
    const BrotliEncoderParams* params, Hasher* hasher, int* dist_cache,
    size_t* last_insert_len, Command* commands, size_t* num_commands,
    size_t* num_literals) {
  /* Set maximum distance, see section 9.1. of the spec. */
  const size_t max_backward_limit = BROTLI_MAX_BACKWARD_LIMIT(params->lgwin);

  const Command* const orig_commands = commands;
  size_t insert_length = *last_insert_len;
  const size_t pos_end = position + num_bytes;
  const size_t store_end = num_bytes >= FN(StoreLookahead)() ?
      position + num_bytes - FN(StoreLookahead)() + 1 : position;

  /* For speed up heuristics for random data. */
  const size_t random_heuristics_window_size =
      LiteralSpreeLengthForSparseSearch(params);
  size_t apply_random_heuristics = position + random_heuristics_window_size;

  /* Minimum score to accept a backward reference. */
  const score_t kMinScore = BROTLI_SCORE_BASE + 400;

  while (position + FN(HashTypeLength)() < pos_end) {
    size_t max_length = pos_end - position;
    size_t max_distance = BROTLI_MIN(size_t, position, max_backward_limit);
    HasherSearchResult sr;
    sr.len = 0;
    sr.len_x_code = 0;
    sr.distance = 0;
    sr.score = kMinScore;
    if (FN(FindLongestMatch)(hasher, ringbuffer, ringbuffer_mask, dist_cache,
                             position, max_length, max_distance, &sr)) {
      /* Found a match. Let's look for something even better ahead. */
      int delayed_backward_references_in_row = 0;
      --max_length;
      for (;; --max_length) {
        const score_t cost_diff_lazy = 700;
        BROTLI_BOOL is_match_found;
        HasherSearchResult sr2;
        sr2.len = params->quality < MIN_QUALITY_FOR_EXTENSIVE_REFERENCE_SEARCH ?
            BROTLI_MIN(size_t, sr.len - 1, max_length) : 0;
        sr2.len_x_code = 0;
        sr2.distance = 0;
        sr2.score = kMinScore;
        max_distance = BROTLI_MIN(size_t, position + 1, max_backward_limit);
        is_match_found = FN(FindLongestMatch)(hasher, ringbuffer,
            ringbuffer_mask, dist_cache, position + 1, max_length, max_distance,
            &sr2);
        if (is_match_found && sr2.score >= sr.score + cost_diff_lazy) {
          /* Ok, let's just write one byte for now and start a match from the
             next byte. */
          ++position;
          ++insert_length;
          sr = sr2;
          if (++delayed_backward_references_in_row < 4 &&
              position + FN(HashTypeLength)() < pos_end) {
            continue;
          }
        }
        break;
      }
      apply_random_heuristics =
          position + 2 * sr.len + random_heuristics_window_size;
      max_distance = BROTLI_MIN(size_t, position, max_backward_limit);
      {
        /* The first 16 codes are special short-codes,
           and the minimum offset is 1. */
        size_t distance_code =
            ComputeDistanceCode(sr.distance, max_distance, dist_cache);
        if (sr.distance <= max_distance && distance_code > 0) {
          dist_cache[3] = dist_cache[2];
          dist_cache[2] = dist_cache[1];
          dist_cache[1] = dist_cache[0];
          dist_cache[0] = (int)sr.distance;
        }
        InitCommand(commands++, insert_length, sr.len, sr.len ^ sr.len_x_code,
            distance_code);
      }
      *num_literals += insert_length;
      insert_length = 0;
      /* Put the hash keys into the table, if there are enough bytes left.
         Depending on the hasher implementation, it can push all positions
         in the given range or only a subset of them. */
      FN(StoreRange)(hasher, ringbuffer, ringbuffer_mask, position + 2,
                     BROTLI_MIN(size_t, position + sr.len, store_end));
      position += sr.len;
    } else {
      ++insert_length;
      ++position;
      /* If we have not seen matches for a long time, we can skip some
         match lookups. Unsuccessful match lookups are very very expensive
         and this kind of a heuristic speeds up compression quite
         a lot. */
      if (position > apply_random_heuristics) {
        /* Going through uncompressible data, jump. */
        if (position >
            apply_random_heuristics + 4 * random_heuristics_window_size) {
          /* It is quite a long time since we saw a copy, so we assume
             that this data is not compressible, and store hashes less
             often. Hashes of non compressible data are less likely to
             turn out to be useful in the future, too, so we store less of
             them to not to flood out the hash table of good compressible
             data. */
          const size_t kMargin =
              BROTLI_MAX(size_t, FN(StoreLookahead)() - 1, 4);
          size_t pos_jump =
              BROTLI_MIN(size_t, position + 16, pos_end - kMargin);
          for (; position < pos_jump; position += 4) {
            FN(Store)(hasher, ringbuffer, ringbuffer_mask, position);
            insert_length += 4;
          }
        } else {
          const size_t kMargin =
              BROTLI_MAX(size_t, FN(StoreLookahead)() - 1, 2);
          size_t pos_jump =
              BROTLI_MIN(size_t, position + 8, pos_end - kMargin);
          for (; position < pos_jump; position += 2) {
            FN(Store)(hasher, ringbuffer, ringbuffer_mask, position);
            insert_length += 2;
          }
        }
      }
    }
  }
  insert_length += pos_end - position;
  *last_insert_len = insert_length;
  *num_commands += (size_t)(commands - orig_commands);
}